

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall
MxxColl_GatherGeneral_Test::~MxxColl_GatherGeneral_Test(MxxColl_GatherGeneral_Test *this)

{
  MxxColl_GatherGeneral_Test *this_local;
  
  ~MxxColl_GatherGeneral_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxColl, GatherGeneral) {
    mxx::comm c;

    size_t size = 13;
    std::vector<unsigned> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = i*3*c.rank();
    }

    std::vector<unsigned> all;
    if (c.rank() == c.size()-1) {
        all.resize(13*c.size());
    }
    // test general function
    mxx::gather(&els[0], size, &all[0], c.size()-1, c);

    if (c.rank() == c.size()-1) {
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (int)size; ++j) {
                ASSERT_EQ((unsigned)j*3*i, all[i*size + j]);
            }
        }
    }

    // test convenience functions
    all = mxx::gather(&els[0], size, c.size()-1, MPI_COMM_WORLD);
    if (c.rank() == c.size()-1) {
        ASSERT_EQ(size*c.size(), all.size());
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (int)size; ++j) {
                ASSERT_EQ((unsigned)j*3*i, all[i*size + j]);
            }
        }
    } else {
        ASSERT_EQ(0, (int)all.size());
    }
    // test convenience functions
    all = mxx::gather(els, c.size()-1, MPI_COMM_WORLD);
    if (c.rank() == c.size()-1) {
        ASSERT_EQ(size*c.size(), all.size());
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (int)size; ++j) {
                ASSERT_EQ((unsigned)j*3*i, all[i*size + j]);
            }
        }
    } else {
        ASSERT_EQ(0, (int)all.size());
    }
}